

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

ConnectionSyntax __thiscall
CPP::WriteInitialization::connectionSyntax
          (WriteInitialization *this,SignalSlot *sender,SignalSlot *receiver)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  ConnectionSyntax CVar4;
  ConnectionSyntax CVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  QStringView QVar8;
  QStringView QVar9;
  QLatin1String QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  
  CVar5 = MemberFunctionPtr;
  if ((*(uint *)this->m_option >> 9 & 1) == 0) {
    CVar4 = StringBased;
    CVar5 = StringBased;
    if ((*(uint *)this->m_option >> 10 & 1) == 0) {
      if (connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)::
          requiresStringSyntax == '\0') {
        connectionSyntax();
      }
      QVar13.m_data = (sender->className).d.ptr;
      QVar13.m_size = (sender->className).d.size;
      cVar2 = QtPrivate::QStringList_contains
                        ((QList *)&connectionSyntax::requiresStringSyntax,QVar13,CaseSensitive);
      CVar5 = CVar4;
      if ((cVar2 == '\0') &&
         (QVar14.m_data = (receiver->className).d.ptr, QVar14.m_size = (receiver->className).d.size,
         cVar2 = QtPrivate::QStringList_contains
                           ((QList *)&connectionSyntax::requiresStringSyntax,QVar14,CaseSensitive),
         cVar2 == '\0')) {
        lVar1 = (sender->name).d.size;
        pcVar6 = (this->m_mainFormVarName).d.ptr;
        qVar7 = (this->m_mainFormVarName).d.size;
        if ((lVar1 == qVar7) &&
           (QVar8.m_data = (sender->name).d.ptr, QVar8.m_size = lVar1, QVar11.m_data = pcVar6,
           QVar11.m_size = lVar1, cVar2 = QtPrivate::equalStrings(QVar8,QVar11), qVar7 = lVar1,
           cVar2 != '\0')) {
          QVar15.m_data = (sender->signature).d.ptr;
          QVar15.m_size = (sender->signature).d.size;
          cVar2 = QtPrivate::QStringList_contains
                            ((QList *)&this->m_customSignals,QVar15,CaseSensitive);
          if (cVar2 != '\0') {
            return StringBased;
          }
          pcVar6 = (this->m_mainFormVarName).d.ptr;
          qVar7 = (this->m_mainFormVarName).d.size;
        }
        if ((((receiver->name).d.size != qVar7) ||
            (QVar9.m_data = (receiver->name).d.ptr, QVar9.m_size = qVar7, QVar12.m_data = pcVar6,
            QVar12.m_size = qVar7, cVar2 = QtPrivate::equalStrings(QVar9,QVar12), cVar2 == '\0')) ||
           (QVar16.m_data = (receiver->signature).d.ptr,
           QVar16.m_size = (receiver->signature).d.size,
           cVar2 = QtPrivate::QStringList_contains
                             ((QList *)&this->m_customSlots,QVar16,CaseSensitive), cVar2 == '\0')) {
          CVar5 = MemberFunctionPtr;
          QVar10.m_data = (char *)0x2;
          QVar10.m_size = (qsizetype)&sender->signature;
          cVar2 = QString::endsWith(QVar10,0x1776bd);
          if (cVar2 == '\0') {
            bVar3 = isCustomWidget(this,&sender->className);
            CVar5 = StringBased;
            if (!bVar3) {
              bVar3 = isCustomWidget(this,&receiver->className);
              CVar5 = (ConnectionSyntax)!bVar3;
            }
          }
        }
      }
    }
  }
  return CVar5;
}

Assistant:

ConnectionSyntax WriteInitialization::connectionSyntax(const language::SignalSlot &sender,
                                                       const language::SignalSlot &receiver) const
{
    if (m_option.forceMemberFnPtrConnectionSyntax)
        return ConnectionSyntax::MemberFunctionPtr;
    if (m_option.forceStringConnectionSyntax)
        return ConnectionSyntax::StringBased;
    // Auto mode: Use Qt 5 connection syntax for Qt classes and parameterless
    // connections. QAxWidget is special though since it has a fake Meta object.
    static const QStringList requiresStringSyntax{QStringLiteral("QAxWidget")};
    if (requiresStringSyntax.contains(sender.className)
        || requiresStringSyntax.contains(receiver.className)) {
        return ConnectionSyntax::StringBased;
    }

    if ((sender.name == m_mainFormVarName && m_customSignals.contains(sender.signature))
         || (receiver.name == m_mainFormVarName && m_customSlots.contains(receiver.signature))) {
        return ConnectionSyntax::StringBased;
    }

    return sender.signature.endsWith("()"_L1)
        || (!isCustomWidget(sender.className) && !isCustomWidget(receiver.className))
        ? ConnectionSyntax::MemberFunctionPtr : ConnectionSyntax::StringBased;
}